

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreEarlyFragmentTestsTest::Run
          (ImageLoadStoreEarlyFragmentTestsTest *this)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  GLenum GVar5;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindImageTexture(this_00,0,this->m_texture_id,0,'\0',0,0x88ba,0x822e);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"BindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x269c);
  glu::CallLogWrapper::glEnable(this_00,0xb71);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"glEnable",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x283e);
  glu::CallLogWrapper::glClearDepthf(this_00,0.5);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"ClearDepthf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2841);
  glu::CallLogWrapper::glClearStencil(this_00,0);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"ClearStencil",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2844);
  glu::CallLogWrapper::glUseProgram(this_00,(this->m_enabled_early_tests).m_program_id);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"glUseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2849);
  glu::CallLogWrapper::glClear(this_00,0x4500);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x284c);
  cleanTexture(this);
  glu::CallLogWrapper::glUniform1i(this_00,(this->m_enabled_early_tests).m_image_uniform_location,0)
  ;
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Uniform1i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2851);
  glu::CallLogWrapper::glUniform1f
            (this_00,(this->m_enabled_early_tests).m_depth_uniform_location,0.5);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Uniform1f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2854);
  glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2857);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0xffffffff);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x285a);
  bVar2 = isTextureFilledWithValue(this,0.0);
  if (!bVar2) {
    local_1a8._0_8_ =
         ((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
         m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Problem with early z test. It is not applied",0x2c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
  }
  glu::CallLogWrapper::glClear(this_00,0x4500);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2869);
  cleanTexture(this);
  glu::CallLogWrapper::glUniform1i(this_00,(this->m_enabled_early_tests).m_image_uniform_location,0)
  ;
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Uniform1i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x286e);
  glu::CallLogWrapper::glUniform1f
            (this_00,(this->m_enabled_early_tests).m_depth_uniform_location,-0.5);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Uniform1f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2871);
  glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2874);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0xffffffff);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2877);
  bVar3 = isTextureFilledWithValue(this,1.0);
  if (!bVar3) {
    local_1a8._0_8_ =
         ((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
         m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Problem with early z test. It discards fragments, that shall be drawn",0x45);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    bVar2 = false;
  }
  glu::CallLogWrapper::glUseProgram(this_00,(this->m_disabled_early_tests).m_program_id);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"glUseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2886);
  glu::CallLogWrapper::glClear(this_00,0x4500);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2889);
  cleanTexture(this);
  glu::CallLogWrapper::glUniform1i
            (this_00,(this->m_disabled_early_tests).m_image_uniform_location,0);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Uniform1i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x288e);
  glu::CallLogWrapper::glUniform1f
            (this_00,(this->m_disabled_early_tests).m_depth_uniform_location,0.5);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Uniform1f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2891);
  glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2894);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0xffffffff);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2897);
  bVar3 = isTextureFilledWithValue(this,1.0);
  if (!bVar3) {
    local_1a8._0_8_ =
         ((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
         m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Problem with early z test. It is applied when disabled",0x36);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    bVar2 = false;
  }
  glu::CallLogWrapper::glDisable(this_00,0xb71);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Disable",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x28a4);
  glu::CallLogWrapper::glEnable(this_00,0xb90);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"glEnable",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27bf);
  glu::CallLogWrapper::glClearDepthf(this_00,1.0);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"ClearDepthf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27c2);
  glu::CallLogWrapper::glUseProgram(this_00,(this->m_enabled_early_tests).m_program_id);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"glUseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27c7);
  glu::CallLogWrapper::glClearStencil(this_00,0);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"ClearStencil",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27ca);
  glu::CallLogWrapper::glClear(this_00,0x4500);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27cd);
  cleanTexture(this);
  glu::CallLogWrapper::glStencilFunc(this_00,0x201,0x80,0xffffffff);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"StencilFunc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27d2);
  glu::CallLogWrapper::glUniform1i(this_00,(this->m_enabled_early_tests).m_image_uniform_location,0)
  ;
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Uniform1i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27d5);
  glu::CallLogWrapper::glUniform1f
            (this_00,(this->m_enabled_early_tests).m_depth_uniform_location,0.0);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Uniform1f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27d8);
  glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27db);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0xffffffff);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27de);
  bVar3 = isTextureFilledWithValue(this,0.0);
  if (!bVar3) {
    local_1a8._0_8_ =
         ((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
         m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Problem with early stencil test. It is not applied",0x32);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
  }
  glu::CallLogWrapper::glClearStencil(this_00,0x80);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"ClearStencil",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27ed);
  glu::CallLogWrapper::glClear(this_00,0x4500);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27f0);
  cleanTexture(this);
  glu::CallLogWrapper::glStencilFunc(this_00,0x201,0,0xffffffff);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"StencilFunc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27f5);
  glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27f8);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0xffffffff);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27fb);
  bVar4 = isTextureFilledWithValue(this,1.0);
  if (!bVar4) {
    local_1a8._0_8_ =
         ((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
         m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Problem with early stencil test. It discards fragments, that shall be drawn",0x4b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    bVar3 = false;
  }
  glu::CallLogWrapper::glUseProgram(this_00,(this->m_disabled_early_tests).m_program_id);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"glUseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x280b);
  glu::CallLogWrapper::glClearStencil(this_00,0);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"ClearStencil",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x280e);
  glu::CallLogWrapper::glClear(this_00,0x4500);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2811);
  cleanTexture(this);
  glu::CallLogWrapper::glStencilFunc(this_00,0x201,0x80,0xffffffff);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"StencilFunc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2816);
  glu::CallLogWrapper::glUniform1i
            (this_00,(this->m_disabled_early_tests).m_image_uniform_location,0);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Uniform1i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2819);
  glu::CallLogWrapper::glUniform1f
            (this_00,(this->m_disabled_early_tests).m_depth_uniform_location,0.0);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Uniform1f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x281c);
  glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x281f);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0xffffffff);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2822);
  bVar4 = isTextureFilledWithValue(this,1.0);
  if (!bVar4) {
    local_1a8._0_8_ =
         ((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
         m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Problem with early stencil test. It is applied when disabled",0x3c
              );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    bVar3 = false;
  }
  glu::CallLogWrapper::glDisable(this_00,0xb90);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Disable",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x282f);
  return (ulong)(byte)(bVar2 & bVar3) - 1;
}

Assistant:

virtual long Run()
	{
		bool result = true;

		/* Bind texture to first image unit */
		glBindImageTexture(0 /* first image unit */, m_texture_id, 0 /* level */, GL_FALSE /* layered */, 0 /* layer */,
						   GL_READ_WRITE, GL_R32F);
		GLU_EXPECT_NO_ERROR(glGetError(), "BindImageTexture");

		/* Run tests for depth test */
		if (false == testEarlyZ())
		{
			result = false;
		}

		/* Run tests for stencil test */
		if (false == testEarlyStencil())
		{
			result = false;
		}

		/* Return ERROR if any problem was found */
		if (false == result)
		{
			return ERROR;
		}

		/* Done */
		return NO_ERROR;
	}